

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

string * __thiscall
ELFIO::dump::find_value_in_table<ELFIO::version_table_t[2],unsigned_int>
          (string *__return_storage_ptr__,dump *this,version_table_t (*table) [2],uint *key)

{
  uint local_38;
  uint i;
  allocator<char> local_22;
  undefined1 local_21;
  version_table_t (*local_20) [2];
  uint *key_local;
  version_table_t (*table_local) [2];
  string *res;
  
  local_21 = 0;
  local_20 = table;
  key_local = (uint *)this;
  table_local = (version_table_t (*) [2])__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_22)
  ;
  std::allocator<char>::~allocator(&local_22);
  local_38 = 0;
  while( true ) {
    if (1 < local_38) {
      return __return_storage_ptr__;
    }
    if (key_local[(ulong)local_38 * 4] == (*local_20)[0].key) break;
    local_38 = local_38 + 1;
  }
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,*(char **)(key_local + (ulong)local_38 * 4 + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string static find_value_in_table( const T& table, const K& key )
    {
        std::string res = "?";
        for ( unsigned int i = 0; i < sizeof( table ) / sizeof( table[0] );
              ++i ) {
            if ( table[i].key == key ) {
                res = table[i].str;
                break;
            }
        }

        return res;
    }